

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtContextCore.cpp
# Opt level: O1

HRESULT __thiscall
ChakraCoreHostScriptContext::FetchImportedModule
          (ChakraCoreHostScriptContext *this,ModuleRecordBase *referencingModule,LPCOLESTR specifier
          ,ModuleRecordBase **dependentModuleRecord)

{
  JsErrorCode JVar1;
  JavascriptString *pJVar2;
  HRESULT HVar3;
  ModuleRecordBase *local_40;
  JsModuleRecord dependentRecord;
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  
  if (this->fetchImportedModuleCallback == (FetchImportedModuleCallBack)0x0) {
    HVar3 = -0x7ff8ffa9;
  }
  else {
    pJVar2 = Js::JavascriptString::NewCopySz
                       (specifier,(this->super_HostScriptContext).scriptContext);
    local_40 = (ModuleRecordBase *)0x0;
    AutoFilterExceptionRegion::AutoFilterExceptionRegion
              ((AutoFilterExceptionRegion *)((long)&dependentRecord + 4),ExceptionType_All);
    JVar1 = (*this->fetchImportedModuleCallback)(referencingModule,pJVar2,&local_40);
    HVar3 = -0x7ff8ffa9;
    if (JVar1 == JsNoError) {
      *dependentModuleRecord = local_40;
      HVar3 = 0;
    }
    AutoFilterExceptionRegion::~AutoFilterExceptionRegion
              ((AutoFilterExceptionRegion *)((long)&dependentRecord + 4));
  }
  return HVar3;
}

Assistant:

HRESULT ChakraCoreHostScriptContext::FetchImportedModule(Js::ModuleRecordBase* referencingModule, LPCOLESTR specifier, Js::ModuleRecordBase** dependentModuleRecord)
{
    if (fetchImportedModuleCallback == nullptr)
    {
        return E_INVALIDARG;
    }
    Js::JavascriptString* specifierVar = Js::JavascriptString::NewCopySz(specifier, GetScriptContext());
    JsModuleRecord dependentRecord = JS_INVALID_REFERENCE;
    {
        AUTO_NO_EXCEPTION_REGION;
        JsErrorCode errorCode = fetchImportedModuleCallback(referencingModule, specifierVar, &dependentRecord);
        if (errorCode == JsNoError)
        {
            *dependentModuleRecord = static_cast<Js::ModuleRecordBase*>(dependentRecord);
            return NOERROR;
        }
    }
    return E_INVALIDARG;
}